

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

int __thiscall VPLGrammar::Parser::FunctionDefinitionNode::GetType(FunctionDefinitionNode *this)

{
  FunctionDefinitionNode *this_local;
  
  return 1;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                out << "func " << scope->GetLastFunctionName() << '\n';
                scope->SpawnFunctionScope();
                children_[1]->BuildProgram(scope, out);
                scope->CloseScope();
                out << "    ret\n";
            }